

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O2

void __thiscall NameServer::generateSplitInfo(NameServer *this)

{
  int iVar1;
  long lVar2;
  int __val;
  ulong uVar3;
  uint __val_00;
  uint uVar4;
  pointer pcVar5;
  int j;
  int iVar6;
  uint uVar7;
  double dVar8;
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110 [2];
  vector<int,_std::allocator<int>_> _serverids;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  blockPathList;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>
  local_98;
  string local_70;
  string local_50;
  
  std::istream::seekg(0x151788,_S_beg);
  lVar2 = std::istream::tellg();
  std::istream::seekg(0x151788,_S_beg);
  dVar8 = ceil((double)lVar2 * 4.76837158203125e-07);
  std::__cxx11::string::string((string *)&local_98,(string *)&desFileName_abi_cxx11_);
  local_98.second = lVar2;
  std::
  pair<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>_>
  ::
  pair<int_&,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>,_true>
            ((pair<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>_>
              *)local_120,&fileID,&local_98);
  std::
  _Rb_tree<int,std::pair<int_const,std::pair<std::__cxx11::string,long_long>>,std::_Select1st<std::pair<int_const,std::pair<std::__cxx11::string,long_long>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,long_long>>>>
  ::_M_emplace_unique<std::pair<int,std::pair<std::__cxx11::string,long_long>>>
            ((_Rb_tree<int,std::pair<int_const,std::pair<std::__cxx11::string,long_long>>,std::_Select1st<std::pair<int_const,std::pair<std::__cxx11::string,long_long>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,long_long>>>>
              *)&fileid_path_lenMap_abi_cxx11_,
             (pair<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>_>
              *)local_120);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)local_120,(string *)&desFileName_abi_cxx11_);
  local_110[1]._0_8_ = lVar2;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long_long>,std::_Select1st<std::pair<std::__cxx11::string_const,long_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long_long>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,long_long>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long_long>,std::_Select1st<std::pair<std::__cxx11::string_const,long_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long_long>>>
              *)&path_lenMap_abi_cxx11_,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>
              *)local_120);
  uVar7 = (uint)dVar8;
  std::__cxx11::string::~string((string *)local_120);
  fileID = fileID + 1;
  blockPathList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blockPathList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  blockPathList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __val_00 = 0;
  uVar4 = 0;
  if (0 < (int)uVar7) {
    uVar4 = uVar7;
  }
  for (; uVar4 != __val_00; __val_00 = __val_00 + 1) {
    std::operator+(&local_98.first,&desFileName_abi_cxx11_,"-part");
    std::__cxx11::to_string(&local_70,__val_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                   &local_98.first,&local_70);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&blockPathList,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_120,&desFileName_abi_cxx11_,&blockPathList);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              *)&logicFile_BlockFileMap_abi_cxx11_,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_120);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_120);
  for (uVar3 = 0; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    _serverids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    _serverids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    _serverids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    __val = (int)uVar3;
    local_120._0_4_ =
         (undefined4)
         ((long)((ulong)(uint)(__val >> 0x1f) << 0x20 | uVar3 & 0xffffffff) % (long)dataserver_num);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&_serverids,(int *)local_120);
    pcVar5 = (pointer)(uVar3 << 0x15);
    iVar1 = (int)lVar2 - (int)pcVar5;
    if (uVar3 != uVar7 - 1) {
      iVar1 = 0x200000;
    }
    local_120._0_4_ =
         (undefined4)
         ((long)((ulong)(uint)(__val >> 0x1f) << 0x20 | uVar3 & 0xffffffff) % (long)dataserver_num);
    local_118._M_p = pcVar5;
    local_110[0]._0_4_ = iVar1;
    local_110[0]._4_4_ = __val;
    std::
    _Rb_tree<int,std::pair<int_const,fileRange>,std::_Select1st<std::pair<int_const,fileRange>>,std::less<int>,std::allocator<std::pair<int_const,fileRange>>>
    ::_M_emplace_equal<std::pair<int,fileRange>>
              ((_Rb_tree<int,std::pair<int_const,fileRange>,std::_Select1st<std::pair<int_const,fileRange>>,std::less<int>,std::allocator<std::pair<int_const,fileRange>>>
                *)&server_fileRangesMap,(pair<int,_fileRange> *)local_120);
    for (iVar6 = 1; iVar6 < replicate_num; iVar6 = iVar6 + 1) {
      local_120._0_4_ = (__val + iVar6) % dataserver_num;
      local_118._M_p = pcVar5;
      local_110[0]._0_4_ = iVar1;
      local_110[0]._4_4_ = __val;
      std::
      _Rb_tree<int,std::pair<int_const,fileRange>,std::_Select1st<std::pair<int_const,fileRange>>,std::less<int>,std::allocator<std::pair<int_const,fileRange>>>
      ::_M_emplace_equal<std::pair<int,fileRange>>
                ((_Rb_tree<int,std::pair<int_const,fileRange>,std::_Select1st<std::pair<int_const,fileRange>>,std::less<int>,std::allocator<std::pair<int_const,fileRange>>>
                  *)&server_fileRangesMap,(pair<int,_fileRange> *)local_120);
      local_120._0_4_ = (__val + iVar6) % dataserver_num;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&_serverids,(int *)local_120);
    }
    std::operator+(&local_70,&desFileName_abi_cxx11_,"-part");
    std::__cxx11::to_string(&local_50,__val);
    std::operator+(&local_98.first,&local_70,&local_50);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                *)local_120,&local_98.first,&_serverids);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                *)&block_serversMap_abi_cxx11_,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                *)local_120);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
             *)local_120);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_serverids.super__Vector_base<int,_std::allocator<int>_>);
  }
  writeMeta(this,id_file);
  writeMeta(this,file_len);
  writeMeta(this,file_block);
  writeMeta(this,block_server);
  writeMeta(this,current_id);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&blockPathList);
  return;
}

Assistant:

void generateSplitInfo() const
    {
        ifs.seekg (0, ifs.end);
        long long length = ifs.tellg();
        ifs.seekg (0, ifs.beg);

        int blockNum = (int)ceil(length / block_size);

        // metadata: key=fileId, value=logicFilePath
        fileid_path_lenMap.emplace(make_pair(fileID, make_pair(desFileName, length)));
        path_lenMap.emplace(make_pair(desFileName, length));

        fileID++;

        vector<string> blockPathList;
        for (int i = 0; i < blockNum; i++)
        {
            blockPathList.push_back(desFileName + "-part" + to_string(i));
        }
        logicFile_BlockFileMap.emplace(make_pair(desFileName, blockPathList));

        for (int i = 0; i < blockNum; i++)
        {

            vector<int> _serverids;
            _serverids.push_back(i % dataserver_num);

            fileRange range(i * block_size_int, 0, i);

            if (i == blockNum - 1)
            {
                range.count = length - i * block_size_int;
            }
            else
            {
                range.count = block_size_int;
            }
            server_fileRangesMap.emplace(make_pair(i % dataserver_num, range));
            // still should crate another two replications
            for (int j = 1; j < replicate_num; j++)
            {
                server_fileRangesMap.emplace(make_pair((i + j) % dataserver_num, range));

                _serverids.push_back((i + j) % dataserver_num);
            }

            block_serversMap.emplace(make_pair(desFileName + "-part" + to_string(i),
               _serverids));
        }

        // write metadata info to file
        writeMeta(MetaType::id_file);
        writeMeta(MetaType::file_len);
        writeMeta(MetaType::file_block);
        writeMeta(MetaType::block_server);
        writeMeta(MetaType::current_id);

    }